

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

void __thiscall cmSystemTools::EnvDiff::ApplyToCurrentEnv(EnvDiff *this,ostringstream *measurement)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  cmAlphaNum local_b0;
  cmAlphaNum local_80;
  string env_update;
  
  for (p_Var2 = *(_Rb_tree_node_base **)&this->field_0x18;
      p_Var2 != (_Rb_tree_node_base *)&this->field_0x8;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if ((char)p_Var2[3]._M_color == _S_black) {
      local_80.View_._M_str = *(char **)(p_Var2 + 1);
      local_80.View_._M_len = (size_t)p_Var2[1]._M_parent;
      local_b0.View_._M_len = 1;
      local_b0.View_._M_str = local_b0.Digits_;
      local_b0.Digits_[0] = '=';
      cmStrCat<std::__cxx11::string>
                (&env_update,&local_80,&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var2 + 2));
      cmsys::SystemTools::PutEnv(&env_update);
      if (measurement != (ostringstream *)0x0) {
        poVar1 = std::operator<<((ostream *)measurement,(string *)&env_update);
        std::endl<char,std::char_traits<char>>(poVar1);
      }
      std::__cxx11::string::~string((string *)&env_update);
    }
    else {
      unsetenv(*(char **)(p_Var2 + 1));
      if (measurement != (ostringstream *)0x0) {
        poVar1 = std::operator<<((ostream *)measurement,'#');
        poVar1 = std::operator<<(poVar1,(string *)(p_Var2 + 1));
        std::operator<<(poVar1,"=\n");
      }
    }
  }
  return;
}

Assistant:

void cmSystemTools::EnvDiff::ApplyToCurrentEnv(std::ostringstream* measurement)
{
  for (auto const& env_apply : diff) {
    if (env_apply.second) {
      auto const env_update =
        cmStrCat(env_apply.first, '=', *env_apply.second);
      cmSystemTools::PutEnv(env_update);
      if (measurement) {
        *measurement << env_update << std::endl;
      }
    } else {
      cmSystemTools::UnsetEnv(env_apply.first.c_str());
      if (measurement) {
        // Signify that this variable is being actively unset
        *measurement << '#' << env_apply.first << "=\n";
      }
    }
  }
}